

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O0

VRDatumIntArray * __thiscall MinVR::VRDatumPtr::intArrayVal(VRDatumPtr *this)

{
  VRCORETYPE_ID VVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  string *in_stack_00000128;
  int *in_stack_00000130;
  string *in_stack_00000138;
  string *in_stack_00000140;
  string *in_stack_00000148;
  VRError *in_stack_00000150;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  
  VVar1 = VRDatum::getType((VRDatum *)*in_RDI);
  if (VVar1 == VRCORETYPE_INTARRAY) {
    return (VRDatumIntArray *)*in_RDI;
  }
  uVar2 = __cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  VRError::VRError(in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138,
                   in_stack_00000130,in_stack_00000128);
  __cxa_throw(uVar2,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRDatumIntArray* intArrayVal()
  {
    if (pData->getType() == VRCORETYPE_INTARRAY) {
      return static_cast<VRDatumIntArray*>(pData);
    } else {
      VRERRORNOADV("This datum is not an array of ints.");
    }
  }